

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O2

S2Cap * __thiscall S2R2Rect::GetCapBound(S2Cap *__return_storage_ptr__,S2R2Rect *this)

{
  VType *pVVar1;
  double dVar2;
  int k;
  int k_00;
  R2Point local_50;
  S2Point local_40;
  
  dVar2 = (this->rect_).bounds_[0].bounds_.c_[0];
  pVVar1 = (this->rect_).bounds_[0].bounds_.c_ + 1;
  if (dVar2 < *pVVar1 || dVar2 == *pVVar1) {
    local_50 = R2Rect::GetCenter(&this->rect_);
    ToS2Point(&local_40,&local_50);
    S2Cap::FromPoint(__return_storage_ptr__,&local_40);
    for (k_00 = 0; k_00 != 4; k_00 = k_00 + 1) {
      local_50 = R2Rect::GetVertex(&this->rect_,k_00);
      ToS2Point(&local_40,&local_50);
      S2Cap::AddPoint(__return_storage_ptr__,&local_40);
    }
  }
  else {
    S2Cap::S2Cap(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2R2Rect::GetCapBound() const {
  if (is_empty()) return S2Cap::Empty();

  // The rectangle is a convex polygon on the sphere, since it is a subset of
  // one cube face.  Its bounding cap is also a convex region on the sphere,
  // and therefore we can bound the rectangle by just bounding its vertices.
  // We use the rectangle's center in (s,t)-space as the cap axis.  This
  // doesn't yield the minimal cap but it's pretty close.
  S2Cap cap = S2Cap::FromPoint(ToS2Point(GetCenter()));
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(ToS2Point(GetVertex(k)));
  }
  return cap;
}